

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O1

bool embree::operator==(Ref<embree::XML> *a,Ref<embree::XML> *b)

{
  XML *pXVar1;
  XML *pXVar2;
  size_t __n;
  Ref<embree::XML> *pRVar3;
  Token *pTVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  Token *a_00;
  Ref<embree::XML> *b_00;
  Token *b_01;
  Ref<embree::XML> *a_01;
  
  pXVar1 = a->ptr;
  pXVar2 = b->ptr;
  __n = (pXVar1->name)._M_string_length;
  if (((__n == (pXVar2->name)._M_string_length) &&
      (((__n == 0 ||
        (iVar7 = bcmp((pXVar1->name)._M_dataplus._M_p,(pXVar2->name)._M_dataplus._M_p,__n),
        iVar7 == 0)) &&
       ((pXVar1->parms)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
        (pXVar2->parms)._M_t._M_impl.super__Rb_tree_header._M_node_count)))) &&
     (bVar5 = std::__equal<false>::
              equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        ((pXVar1->parms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                         (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )&(pXVar1->parms)._M_t._M_impl.super__Rb_tree_header,
                         (pXVar2->parms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left),
     bVar5)) {
    a_01 = (a->ptr->children).
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
    pRVar3 = (a->ptr->children).
             super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    b_00 = (b->ptr->children).
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
    if ((long)pRVar3 - (long)a_01 ==
        (long)(b->ptr->children).
              super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)b_00) {
      bVar5 = a_01 == pRVar3;
      if (!bVar5) {
        bVar6 = operator==(a_01,b_00);
        if (bVar6) {
          do {
            a_01 = a_01 + 1;
            b_00 = b_00 + 1;
            bVar5 = a_01 == pRVar3;
            if (bVar5) goto LAB_0019711c;
            bVar6 = operator==(a_01,b_00);
          } while (bVar6);
        }
        if (!bVar5) {
          return false;
        }
      }
LAB_0019711c:
      a_00 = (a->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
             _M_impl.super__Vector_impl_data._M_start;
      pTVar4 = (a->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      b_01 = (b->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
             _M_impl.super__Vector_impl_data._M_start;
      if ((long)pTVar4 - (long)a_00 ==
          (long)(b->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)b_01) {
        if (a_00 == pTVar4) {
          return a_00 == pTVar4;
        }
        bVar5 = operator==(a_00,b_01);
        if (bVar5) {
          do {
            b_01 = b_01 + 1;
            a_00 = a_00 + 1;
            if (a_00 == pTVar4) {
              return a_00 == pTVar4;
            }
            bVar5 = operator==(a_00,b_01);
          } while (bVar5);
          return false;
        }
      }
    }
  }
  return false;
}

Assistant:

bool operator <( const Ref<XML>& a, const Ref<XML>& b ) {
      if (a->name     != b->name    ) return a->name     < b->name;
      if (a->parms    != b->parms   ) return a->parms    < b->parms;
      if (a->children != b->children) return a->children < b->children;
      if (a->body     != b->body    ) return a->body     < b->body;
      return false;
    }